

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *
kj::consumeHttpMethod
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *__return_storage_ptr__,
          char **ptr)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  HttpMethod local_2b4;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_2b0;
  HttpMethod local_29c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_298;
  HttpMethod local_284;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_280;
  HttpMethod local_26c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_268;
  HttpMethod local_254;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_250;
  HttpMethod local_23c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_238;
  HttpMethod local_224;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_220;
  HttpMethod local_20c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_208;
  HttpMethod local_1f4;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_1f0;
  HttpMethod local_1dc;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_1d8;
  HttpMethod local_1c4;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_1c0;
  HttpMethod local_1ac;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_1a8;
  HttpMethod local_194;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_190;
  HttpMethod local_17c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_178;
  HttpMethod local_164;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_160;
  HttpMethod local_14c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_148;
  HttpMethod local_134;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_130;
  HttpMethod local_11c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_118;
  HttpMethod local_104;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_100;
  HttpMethod local_ec;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_e8;
  HttpMethod local_d4;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_d0;
  HttpMethod local_bc;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_b8;
  HttpMethod local_a4;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_a0;
  HttpConnectMethod local_89;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_88;
  HttpMethod local_74;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_70;
  HttpMethod local_5c;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_58 [2];
  HttpMethod local_34;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_30;
  char *local_20;
  char *p;
  char **ptr_local;
  
  pcVar4 = *ptr;
  local_20 = pcVar4 + 1;
  p = (char *)ptr;
  ptr_local = (char **)__return_storage_ptr__;
  switch(*pcVar4) {
  case 'A':
    iVar2 = strncmp(local_20,"CL",2);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 2;
      local_34 = ACL;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_30,&local_34);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_30);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_30);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  default:
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    break;
  case 'C':
    pcVar3 = pcVar4 + 2;
    if (*local_20 == 'H') {
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"ECKOUT",6);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 6;
        local_5c = CHECKOUT;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)local_58,&local_5c);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,local_58);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(local_58);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    else if (*local_20 == 'O') {
      local_20 = pcVar4 + 3;
      if (*pcVar3 == 'N') {
        iVar2 = strncmp(local_20,"NECT",4);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 4;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpConnectMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_88,&local_89);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_88);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_88);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else if (*pcVar3 == 'P') {
        iVar2 = strncmp(local_20,"Y",1);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 1;
          local_74 = COPY;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_70,&local_74);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_70);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_70);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    else {
      local_20 = pcVar3;
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'D':
    iVar2 = strncmp(local_20,"ELETE",5);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 5;
      local_a4 = DELETE;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_a0,&local_a4);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_a0);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_a0);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'G':
    iVar2 = strncmp(local_20,"ET",2);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 2;
      local_bc = GET;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_b8,&local_bc);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_b8);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_b8);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'H':
    iVar2 = strncmp(local_20,"EAD",3);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 3;
      local_d4 = HEAD;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_d0,&local_d4);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_d0);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_d0);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'L':
    iVar2 = strncmp(local_20,"OCK",3);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 3;
      local_ec = LOCK;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_e8,&local_ec);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_e8);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_e8);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'M':
    pcVar3 = pcVar4 + 2;
    switch(*local_20) {
    case 'E':
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"RGE",3);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 3;
        local_104 = MERGE;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_100,&local_104);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_100);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_100);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    default:
      local_20 = pcVar3;
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      break;
    case 'K':
      local_20 = pcVar4 + 3;
      if (*pcVar3 == 'A') {
        iVar2 = strncmp(local_20,"CTIVITY",7);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 7;
          local_11c = MKACTIVITY;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_118,&local_11c);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_118);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_118);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else if (*pcVar3 == 'C') {
        iVar2 = strncmp(local_20,"OL",2);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 2;
          local_134 = MKCOL;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_130,&local_134);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_130);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_130);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    case 'O':
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"VE",2);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 2;
        local_14c = MOVE;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_148,&local_14c);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_148);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_148);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    case 'S':
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"EARCH",5);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 5;
        local_164 = MSEARCH;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_160,&local_164);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_160);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_160);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    break;
  case 'N':
    iVar2 = strncmp(local_20,"OTIFY",5);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 5;
      local_17c = NOTIFY;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_178,&local_17c);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_178);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_178);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'O':
    iVar2 = strncmp(local_20,"PTIONS",6);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 6;
      local_194 = OPTIONS;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_190,&local_194);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_190);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_190);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'P':
    pcVar3 = pcVar4 + 2;
    switch(*local_20) {
    case 'A':
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"TCH",3);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 3;
        local_1ac = PATCH;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_1a8,&local_1ac);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_1a8);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_1a8);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    default:
      local_20 = pcVar3;
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      break;
    case 'O':
      local_20 = pcVar3;
      iVar2 = strncmp(pcVar3,"ST",2);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 2;
        local_1c4 = POST;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_1c0,&local_1c4);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_1c0);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_1c0);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    case 'R':
      local_20 = pcVar4 + 3;
      if ((*pcVar3 == 'O') && (local_20 = pcVar4 + 4, pcVar4[3] == 'P')) {
        local_20 = pcVar4 + 5;
        cVar1 = pcVar4[4];
        if (cVar1 == 'F') {
          iVar2 = strncmp(local_20,"IND",3);
          if (iVar2 == 0) {
            *(char **)p = local_20 + 3;
            local_1dc = PROPFIND;
            OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                      ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_1d8,&local_1dc);
            Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                      (__return_storage_ptr__,&local_1d8);
            OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_1d8);
          }
          else {
            Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
          }
        }
        else if (cVar1 == 'P') {
          iVar2 = strncmp(local_20,"ATCH",4);
          if (iVar2 == 0) {
            *(char **)p = local_20 + 4;
            local_1f4 = PROPPATCH;
            OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                      ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_1f0,&local_1f4);
            Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                      (__return_storage_ptr__,&local_1f0);
            OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_1f0);
          }
          else {
            Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
          }
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
      break;
    case 'U':
      local_20 = pcVar4 + 3;
      if (*pcVar3 == 'R') {
        iVar2 = strncmp(local_20,"GE",2);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 2;
          local_20c = PURGE;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_208,&local_20c);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_208);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_208);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else if (*pcVar3 == 'T') {
        iVar2 = strncmp(local_20,"",0);
        if (iVar2 == 0) {
          *(char **)p = local_20;
          local_224 = PUT;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_220,&local_224);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_220);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_220);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    break;
  case 'R':
    iVar2 = strncmp(local_20,"EPORT",5);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 5;
      local_23c = REPORT;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_238,&local_23c);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_238);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_238);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'S':
    pcVar4 = pcVar4 + 2;
    if (*local_20 == 'E') {
      local_20 = pcVar4;
      iVar2 = strncmp(pcVar4,"ARCH",4);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 4;
        local_254 = SEARCH;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_250,&local_254);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_250);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_250);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    else if (*local_20 == 'U') {
      local_20 = pcVar4;
      iVar2 = strncmp(pcVar4,"BSCRIBE",7);
      if (iVar2 == 0) {
        *(char **)p = local_20 + 7;
        local_26c = SUBSCRIBE;
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_268,&local_26c);
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                  (__return_storage_ptr__,&local_268);
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_268);
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    else {
      local_20 = pcVar4;
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'T':
    iVar2 = strncmp(local_20,"RACE",4);
    if (iVar2 == 0) {
      *(char **)p = local_20 + 4;
      local_284 = TRACE;
      OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_280,&local_284);
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                (__return_storage_ptr__,&local_280);
      OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_280);
    }
    else {
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
    break;
  case 'U':
    if (*local_20 == 'N') {
      local_20 = pcVar4 + 3;
      cVar1 = pcVar4[2];
      if (cVar1 == 'L') {
        iVar2 = strncmp(local_20,"OCK",3);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 3;
          local_29c = UNLOCK;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_298,&local_29c);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_298);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_298);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else if (cVar1 == 'S') {
        iVar2 = strncmp(local_20,"UBSCRIBE",8);
        if (iVar2 == 0) {
          *(char **)p = local_20 + 8;
          local_2b4 = UNSUBSCRIBE;
          OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                    ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)&local_2b0,&local_2b4);
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
                    (__return_storage_ptr__,&local_2b0);
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_2b0);
        }
        else {
          Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
        }
      }
      else {
        Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
      }
    }
    else {
      local_20 = pcVar4 + 2;
      Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>> consumeHttpMethod(char*& ptr) {
  char* p = ptr;

#define EXPECT_REST(prefix, suffix) \
  if (strncmp(p, #suffix, sizeof(#suffix)-1) == 0) { \
    ptr = p + (sizeof(#suffix)-1); \
    return kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>>(HttpMethod::prefix##suffix); \
  } else { \
    return kj::none; \
  }

  switch (*p++) {
    case 'A': EXPECT_REST(A,CL)
    case 'C':
      switch (*p++) {
        case 'H': EXPECT_REST(CH,ECKOUT)
        case 'O':
          switch (*p++) {
            case 'P': EXPECT_REST(COP,Y)
            case 'N':
              if (strncmp(p, "NECT", 4) == 0) {
                ptr = p + 4;
                return kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>>(HttpConnectMethod());
              } else {
                return kj::none;
              }
            default: return kj::none;
          }
        default: return kj::none;
      }
    case 'D': EXPECT_REST(D,ELETE)
    case 'G': EXPECT_REST(G,ET)
    case 'H': EXPECT_REST(H,EAD)
    case 'L': EXPECT_REST(L,OCK)
    case 'M':
      switch (*p++) {
        case 'E': EXPECT_REST(ME,RGE)
        case 'K':
          switch (*p++) {
            case 'A': EXPECT_REST(MKA,CTIVITY)
            case 'C': EXPECT_REST(MKC,OL)
            default: return kj::none;
          }
        case 'O': EXPECT_REST(MO,VE)
        case 'S': EXPECT_REST(MS,EARCH)
        default: return kj::none;
      }
    case 'N': EXPECT_REST(N,OTIFY)
    case 'O': EXPECT_REST(O,PTIONS)
    case 'P':
      switch (*p++) {
        case 'A': EXPECT_REST(PA,TCH)
        case 'O': EXPECT_REST(PO,ST)
        case 'R':
          if (*p++ != 'O' || *p++ != 'P') return kj::none;
          switch (*p++) {
            case 'F': EXPECT_REST(PROPF,IND)
            case 'P': EXPECT_REST(PROPP,ATCH)
            default: return kj::none;
          }
        case 'U':
          switch (*p++) {
            case 'R': EXPECT_REST(PUR,GE)
            case 'T': EXPECT_REST(PUT,)
            default: return kj::none;
          }
        default: return kj::none;
      }
    case 'R': EXPECT_REST(R,EPORT)
    case 'S':
      switch (*p++) {
        case 'E': EXPECT_REST(SE,ARCH)
        case 'U': EXPECT_REST(SU,BSCRIBE)
        default: return kj::none;
      }
    case 'T': EXPECT_REST(T,RACE)
    case 'U':
      if (*p++ != 'N') return kj::none;
      switch (*p++) {
        case 'L': EXPECT_REST(UNL,OCK)
        case 'S': EXPECT_REST(UNS,UBSCRIBE)
        default: return kj::none;
      }
    default: return kj::none;
  }
#undef EXPECT_REST
}